

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

uint nullcDebugGetSourceLocationLineAndColumn(char *sourceLocation,uint moduleIndex,uint *column)

{
  long lVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  
  lVar1 = *(long *)(NULLC::linker + 0x280);
  if (moduleIndex < *(uint *)(NULLC::linker + 0x28c)) {
    uVar2 = *(uint *)(lVar1 + 0x14 + (ulong)moduleIndex * 0x1c);
  }
  else {
    lVar6 = (ulong)(*(uint *)(NULLC::linker + 0x28c) - 1) * 0x1c;
    uVar2 = *(int *)(lVar1 + 0x18 + lVar6) + *(int *)(lVar1 + 0x14 + lVar6);
  }
  pcVar3 = (char *)(*(long *)(NULLC::linker + 0x2a0) + (ulong)uVar2);
  uVar2 = 0;
  do {
    uVar5 = 0;
    pcVar4 = pcVar3;
    while( true ) {
      pcVar3 = pcVar4 + 1;
      if (sourceLocation <= pcVar4) {
        *column = uVar5;
        return uVar2;
      }
      if (*pcVar4 == '\n') goto LAB_0010d6d9;
      if (*pcVar4 == '\r') break;
      uVar5 = uVar5 + 1;
      pcVar4 = pcVar3;
    }
    if (*pcVar3 == '\n') {
      pcVar3 = pcVar4 + 2;
    }
LAB_0010d6d9:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

unsigned nullcDebugGetSourceLocationLineAndColumn(const char *sourceLocation, unsigned moduleIndex, unsigned &column)
{
	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	const char *sourceStart = fullSource + (moduleIndex < moduleCount ? modules[moduleIndex].sourceOffset : modules[moduleCount - 1].sourceOffset + modules[moduleCount - 1].sourceSize);

	unsigned line = 0;

	const char *pos = sourceStart;
	const char *lastLineStart = pos;

	while(pos < sourceLocation)
	{
		if(*pos == '\r')
		{
			line++;

			pos++;

			if(*pos == '\n')
				pos++;

			lastLineStart = pos;
		}
		else if(*pos == '\n')
		{
			line++;

			pos++;

			lastLineStart = pos;
		}
		else
		{
			pos++;
		}
	}

	column = int(pos - lastLineStart);

	return line;
}